

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

PaError GropeDevice(snd_pcm_t *pcm,int isPlug,StreamDirection mode,int openBlocking,
                   PaAlsaDeviceInfo *devInfo)

{
  undefined8 uVar1;
  double dVar2;
  snd_pcm_t *psVar3;
  int iVar4;
  int iVar5;
  size_t __n;
  long lVar6;
  long lVar7;
  pthread_t pVar8;
  char *pcVar9;
  undefined4 in_register_0000000c;
  snd_pcm_hw_params_t *hwParams;
  PaError PVar10;
  byte bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uStack_90;
  snd_pcm_hw_params_t asStack_88 [8];
  long local_80;
  long local_78;
  long local_70;
  undefined4 local_68;
  undefined1 local_64 [4];
  uint minChans;
  int dir;
  double defaultSr;
  snd_pcm_uframes_t alsaBufferFrames;
  snd_pcm_uframes_t alsaPeriodFrames;
  byte bStack_40;
  undefined7 uStack_3f;
  uint maxChans;
  snd_pcm_t *local_38;
  
  local_70 = CONCAT44(in_register_0000000c,openBlocking);
  hwParams = asStack_88;
  _minChans = *(double *)(local_70 + 0x40);
  _bStack_40 = _minChans;
  if (pcm == (snd_pcm_t *)0x0) {
    uStack_90 = 0x10e799;
    __assert_fail("pcm",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0x34f,
                  "PaError GropeDevice(snd_pcm_t *, int, StreamDirection, int, PaAlsaDeviceInfo *)")
    ;
  }
  bVar11 = mode != StreamDirection_In;
  uStack_90 = 0x10e20a;
  iVar4 = snd_pcm_nonblock();
  if (iVar4 < 0) {
    uStack_90 = 0x10e4b7;
    pVar8 = pthread_self();
    uStack_90 = 0x10e4c9;
    iVar5 = pthread_equal(pVar8,paUnixMainThread);
    if (iVar5 != 0) {
      uStack_90 = 0x10e4d8;
      pcVar9 = (char *)snd_strerror(iVar4);
      uStack_90 = 0x10e4e6;
      PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar4,pcVar9);
    }
    uStack_90 = 0x10e4f4;
    PaUtil_DebugPrint(
                     "Expression \'alsa_snd_pcm_nonblock( pcm, 0 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 866\n"
                     );
    PVar10 = -9999;
    goto LAB_0010e760;
  }
  uStack_90 = 0x10e217;
  __n = snd_pcm_hw_params_sizeof();
  lVar7 = -(__n + 0xf & 0xfffffffffffffff0);
  hwParams = asStack_88 + lVar7;
  *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e235;
  memset(hwParams,0,__n);
  *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e240;
  snd_pcm_hw_params_any(pcm,hwParams);
  dVar2 = _bStack_40;
  local_38 = pcm;
  if (_bStack_40 < 0.0) {
LAB_0010e270:
    if (_bStack_40 < 0.0) goto LAB_0010e291;
LAB_0010e2e8:
    *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e2f4;
    iVar4 = snd_pcm_hw_params_get_channels_min(hwParams,&local_68);
    if (iVar4 < 0) {
      *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e507;
      pVar8 = pthread_self();
      *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e519;
      iVar5 = pthread_equal(pVar8,paUnixMainThread);
      if (iVar5 != 0) {
        *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e528;
        pcVar9 = (char *)snd_strerror(iVar4);
        *(undefined8 *)(asStack_88 + lVar7 + -8) = 8;
        uVar1 = *(undefined8 *)(asStack_88 + lVar7 + -8);
        *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e536;
        PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar1,(long)iVar4,pcVar9);
      }
      pcVar9 = 
      "Expression \'alsa_snd_pcm_hw_params_get_channels_min( hwParams, &minChans )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 897\n"
      ;
    }
    else {
      *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e308;
      iVar4 = snd_pcm_hw_params_get_channels_max(hwParams,(long)&alsaPeriodFrames + 4);
      psVar3 = local_38;
      if (iVar4 < 0) {
        *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e54a;
        pVar8 = pthread_self();
        *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e55c;
        iVar5 = pthread_equal(pVar8,paUnixMainThread);
        if (iVar5 != 0) {
          *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e56b;
          pcVar9 = (char *)snd_strerror(iVar4);
          *(undefined8 *)(asStack_88 + lVar7 + -8) = 8;
          uVar1 = *(undefined8 *)(asStack_88 + lVar7 + -8);
          *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e579;
          PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar1,(long)iVar4,pcVar9);
        }
        pcVar9 = 
        "Expression \'alsa_snd_pcm_hw_params_get_channels_max( hwParams, &maxChans )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 898\n"
        ;
      }
      else {
        local_78 = (ulong)((uint)bVar11 * 4) + 0x54;
        local_80 = (ulong)bVar11 * 8 + 0x20;
        if ((int)alsaPeriodFrames._4_4_ < 0) {
          *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e7b8;
          __assert_fail("maxChans <= INT_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                        ,899,
                        "PaError GropeDevice(snd_pcm_t *, int, StreamDirection, int, PaAlsaDeviceInfo *)"
                       );
        }
        if (alsaPeriodFrames._4_4_ == 0) {
          *(code **)(asStack_88 + lVar7 + -8) = SetApproximateSampleRate;
          __assert_fail("maxChans > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                        ,900,
                        "PaError GropeDevice(snd_pcm_t *, int, StreamDirection, int, PaAlsaDeviceInfo *)"
                       );
        }
        if (0x80 < alsaPeriodFrames._4_4_ && isPlug != 0) {
          alsaPeriodFrames._4_4_ = 0x80;
        }
        defaultSr = 2.52961610670718e-321;
        alsaBufferFrames = 0x80;
        *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e382;
        iVar4 = snd_pcm_hw_params_set_buffer_size_near(psVar3,hwParams);
        if (iVar4 < 0) {
          *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e58d;
          pVar8 = pthread_self();
          *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e59f;
          iVar5 = pthread_equal(pVar8,paUnixMainThread);
          if (iVar5 != 0) {
            *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e5ae;
            pcVar9 = (char *)snd_strerror(iVar4);
            *(undefined8 *)(asStack_88 + lVar7 + -8) = 8;
            uVar1 = *(undefined8 *)(asStack_88 + lVar7 + -8);
            *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e5bc;
            PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar1,(long)iVar4,pcVar9);
          }
          pcVar9 = 
          "Expression \'alsa_snd_pcm_hw_params_set_buffer_size_near( pcm, hwParams, &alsaBufferFrames )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 922\n"
          ;
        }
        else {
          *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e39d;
          iVar4 = snd_pcm_hw_params_set_period_size_near(psVar3,hwParams,&alsaBufferFrames,local_64)
          ;
          if (iVar4 < 0) {
            *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e5d0;
            pVar8 = pthread_self();
            *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e5e2;
            iVar5 = pthread_equal(pVar8,paUnixMainThread);
            if (iVar5 != 0) {
              *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e5f1;
              pcVar9 = (char *)snd_strerror(iVar4);
              *(undefined8 *)(asStack_88 + lVar7 + -8) = 8;
              uVar1 = *(undefined8 *)(asStack_88 + lVar7 + -8);
              *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e5ff;
              PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar1,(long)iVar4,pcVar9);
            }
            pcVar9 = 
            "Expression \'alsa_snd_pcm_hw_params_set_period_size_near( pcm, hwParams, &alsaPeriodFrames, &dir )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 923\n"
            ;
          }
          else {
            lVar6 = (long)defaultSr - alsaBufferFrames;
            auVar12._8_4_ = (int)((ulong)lVar6 >> 0x20);
            auVar12._0_8_ = lVar6;
            auVar12._12_4_ = 0x45300000;
            _bStack_40 = _minChans;
            *(double *)(local_70 + local_80) =
                 ((auVar12._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) / _minChans;
            defaultSr = 1.01184644268287e-320;
            alsaBufferFrames = 0x200;
            *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e404;
            iVar4 = snd_pcm_hw_params_any(psVar3,hwParams);
            dVar2 = _bStack_40;
            if (iVar4 < 0) {
              *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e613;
              pVar8 = pthread_self();
              *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e625;
              iVar5 = pthread_equal(pVar8,paUnixMainThread);
              if (iVar5 != 0) {
                *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e634;
                pcVar9 = (char *)snd_strerror(iVar4);
                *(undefined8 *)(asStack_88 + lVar7 + -8) = 8;
                uVar1 = *(undefined8 *)(asStack_88 + lVar7 + -8);
                *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e642;
                PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar1,(long)iVar4,pcVar9);
              }
              pcVar9 = 
              "Expression \'alsa_snd_pcm_hw_params_any( pcm, hwParams )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 930\n"
              ;
            }
            else {
              *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e41c;
              iVar4 = SetApproximateSampleRate(psVar3,hwParams,dVar2);
              if (iVar4 < 0) {
                *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e656;
                pVar8 = pthread_self();
                *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e668;
                iVar5 = pthread_equal(pVar8,paUnixMainThread);
                if (iVar5 != 0) {
                  *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e677;
                  pcVar9 = (char *)snd_strerror(iVar4);
                  *(undefined8 *)(asStack_88 + lVar7 + -8) = 8;
                  uVar1 = *(undefined8 *)(asStack_88 + lVar7 + -8);
                  *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e685;
                  PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar1,(long)iVar4,pcVar9);
                }
                pcVar9 = 
                "Expression \'SetApproximateSampleRate( pcm, hwParams, defaultSr )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 931\n"
                ;
              }
              else {
                *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e433;
                iVar4 = snd_pcm_hw_params_set_buffer_size_near(psVar3,hwParams,&defaultSr);
                if (iVar4 < 0) {
                  *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e699;
                  pVar8 = pthread_self();
                  *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e6ab;
                  iVar5 = pthread_equal(pVar8,paUnixMainThread);
                  if (iVar5 != 0) {
                    *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e6ba;
                    pcVar9 = (char *)snd_strerror(iVar4);
                    *(undefined8 *)(asStack_88 + lVar7 + -8) = 8;
                    uVar1 = *(undefined8 *)(asStack_88 + lVar7 + -8);
                    *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e6c8;
                    PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar1,(long)iVar4,pcVar9);
                  }
                  pcVar9 = 
                  "Expression \'alsa_snd_pcm_hw_params_set_buffer_size_near( pcm, hwParams, &alsaBufferFrames )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 932\n"
                  ;
                }
                else {
                  *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e44e;
                  iVar4 = snd_pcm_hw_params_set_period_size_near
                                    (psVar3,hwParams,&alsaBufferFrames,local_64);
                  if (-1 < iVar4) {
                    lVar7 = (long)defaultSr - alsaBufferFrames;
                    auVar13._8_4_ = (int)((ulong)lVar7 >> 0x20);
                    auVar13._0_8_ = lVar7;
                    auVar13._12_4_ = 0x45300000;
                    *(double *)(local_70 + ((ulong)bVar11 * 8 | 0x30)) =
                         ((auVar13._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) /
                         _bStack_40;
                    *(undefined4 *)(local_70 + local_78) = local_68;
                    *(uint *)(local_70 + (ulong)((uint)bVar11 * 4) + 0x14) = alsaPeriodFrames._4_4_;
                    *(double *)(local_70 + 0x40) = _bStack_40;
                    PVar10 = 0;
                    pcm = local_38;
                    goto LAB_0010e760;
                  }
                  *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e6d9;
                  pVar8 = pthread_self();
                  *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e6eb;
                  iVar5 = pthread_equal(pVar8,paUnixMainThread);
                  if (iVar5 != 0) {
                    *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e6fa;
                    pcVar9 = (char *)snd_strerror(iVar4);
                    *(undefined8 *)(asStack_88 + lVar7 + -8) = 8;
                    uVar1 = *(undefined8 *)(asStack_88 + lVar7 + -8);
                    *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e708;
                    PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar1,(long)iVar4,pcVar9);
                  }
                  pcVar9 = 
                  "Expression \'alsa_snd_pcm_hw_params_set_period_size_near( pcm, hwParams, &alsaPeriodFrames, &dir )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 933\n"
                  ;
                }
              }
            }
          }
        }
      }
    }
LAB_0010e74f:
    *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e756;
    PaUtil_DebugPrint(pcVar9);
  }
  else {
    *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e263;
    iVar4 = SetApproximateSampleRate(pcm,hwParams,dVar2);
    if (-1 < iVar4) goto LAB_0010e270;
    _minChans = -1.0;
    *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e291;
    snd_pcm_hw_params_any(pcm,hwParams);
LAB_0010e291:
    psVar3 = local_38;
    _bStack_40 = (double)CONCAT71(uStack_3f,bVar11);
    defaultSr = (double)CONCAT44(defaultSr._4_4_,0xac44);
    *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e2b5;
    snd_pcm_hw_params_set_rate_resample(psVar3,hwParams,0);
    *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e2c5;
    iVar4 = snd_pcm_hw_params_set_rate_near(psVar3,hwParams,&defaultSr,0);
    if (-1 < iVar4) {
      *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e2d9;
      iVar4 = GetExactSampleRate(hwParams,(double *)&minChans);
      if (-1 < iVar4) {
        bVar11 = bStack_40;
        goto LAB_0010e2e8;
      }
      *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e719;
      pVar8 = pthread_self();
      *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e72b;
      iVar5 = pthread_equal(pVar8,paUnixMainThread);
      if (iVar5 != 0) {
        *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e73a;
        pcVar9 = (char *)snd_strerror(iVar4);
        *(undefined8 *)(asStack_88 + lVar7 + -8) = 8;
        uVar1 = *(undefined8 *)(asStack_88 + lVar7 + -8);
        *(undefined8 *)(asStack_88 + lVar7 + -8) = 0x10e748;
        PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar1,(long)iVar4,pcVar9);
      }
      pcVar9 = 
      "Expression \'GetExactSampleRate( hwParams, &defaultSr )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 894\n"
      ;
      goto LAB_0010e74f;
    }
  }
  PVar10 = -9999;
  pcm = local_38;
LAB_0010e760:
  *(undefined8 *)(hwParams + -8) = 0x10e768;
  snd_pcm_close(pcm);
  return PVar10;
}

Assistant:

static PaError GropeDevice( snd_pcm_t* pcm, int isPlug, StreamDirection mode, int openBlocking,
        PaAlsaDeviceInfo* devInfo )
{
    PaError result = paNoError;
    snd_pcm_hw_params_t *hwParams;
    snd_pcm_uframes_t alsaBufferFrames, alsaPeriodFrames;
    unsigned int minChans, maxChans;
    int* minChannels, * maxChannels;
    double * defaultLowLatency, * defaultHighLatency, * defaultSampleRate =
        &devInfo->baseDeviceInfo.defaultSampleRate;
    double defaultSr = *defaultSampleRate;
    int dir;

    assert( pcm );

    PA_DEBUG(( "%s: collecting info ..\n", __FUNCTION__ ));

    if( StreamDirection_In == mode )
    {
        minChannels = &devInfo->minInputChannels;
        maxChannels = &devInfo->baseDeviceInfo.maxInputChannels;
        defaultLowLatency = &devInfo->baseDeviceInfo.defaultLowInputLatency;
        defaultHighLatency = &devInfo->baseDeviceInfo.defaultHighInputLatency;
    }
    else
    {
        minChannels = &devInfo->minOutputChannels;
        maxChannels = &devInfo->baseDeviceInfo.maxOutputChannels;
        defaultLowLatency = &devInfo->baseDeviceInfo.defaultLowOutputLatency;
        defaultHighLatency = &devInfo->baseDeviceInfo.defaultHighOutputLatency;
    }

    ENSURE_( alsa_snd_pcm_nonblock( pcm, 0 ), paUnanticipatedHostError );

    alsa_snd_pcm_hw_params_alloca( &hwParams );
    alsa_snd_pcm_hw_params_any( pcm, hwParams );

    if( defaultSr >= 0 )
    {
        /* Could be that the device opened in one mode supports samplerates that the other mode wont have,
         * so try again .. */
        if( SetApproximateSampleRate( pcm, hwParams, defaultSr ) < 0 )
        {
            defaultSr = -1.;
            alsa_snd_pcm_hw_params_any( pcm, hwParams ); /* Clear any params (rate) that might have been set */
            PA_DEBUG(( "%s: Original default samplerate failed, trying again ..\n", __FUNCTION__ ));
        }
    }

    if( defaultSr < 0. )           /* Default sample rate not set */
    {
        unsigned int sampleRate = 44100;        /* Will contain approximate rate returned by alsa-lib */

        /* Don't allow rate resampling when probing for the default rate (but ignore if this call fails) */
        alsa_snd_pcm_hw_params_set_rate_resample( pcm, hwParams, 0 );
        if( alsa_snd_pcm_hw_params_set_rate_near( pcm, hwParams, &sampleRate, NULL ) < 0 )
        {
            result = paUnanticipatedHostError;
            goto error;
        }
        ENSURE_( GetExactSampleRate( hwParams, &defaultSr ), paUnanticipatedHostError );
    }

    ENSURE_( alsa_snd_pcm_hw_params_get_channels_min( hwParams, &minChans ), paUnanticipatedHostError );
    ENSURE_( alsa_snd_pcm_hw_params_get_channels_max( hwParams, &maxChans ), paUnanticipatedHostError );
    assert( maxChans <= INT_MAX );
    assert( maxChans > 0 );    /* Weird linking issue could cause wrong version of ALSA symbols to be called,
                                   resulting in zeroed values */

    /* XXX: Limit to sensible number (ALSA plugins accept a crazy amount of channels)? */
    if( isPlug && maxChans > 128 )
    {
        maxChans = 128;
        PA_DEBUG(( "%s: Limiting number of plugin channels to %u\n", __FUNCTION__, maxChans ));
    }

    /* TWEAKME:
     * Giving values for default min and max latency is not straightforward.
     *  * for low latency, we want to give the lowest value that will work reliably.
     *      This varies based on the sound card, kernel, CPU, etc.  Better to give
     *      sub-optimal latency than to give a number too low and cause dropouts.
     *  * for high latency we want to give a large enough value that dropouts are basically impossible.
     *      This doesn't really require as much tweaking, since providing too large a number will
     *      just cause us to select the nearest setting that will work at stream config time.
     */
    /* Try low latency values, (sometimes the buffer & period that result are larger) */
    alsaBufferFrames = 512;
    alsaPeriodFrames = 128;
    ENSURE_( alsa_snd_pcm_hw_params_set_buffer_size_near( pcm, hwParams, &alsaBufferFrames ), paUnanticipatedHostError );
    ENSURE_( alsa_snd_pcm_hw_params_set_period_size_near( pcm, hwParams, &alsaPeriodFrames, &dir ), paUnanticipatedHostError );
    *defaultLowLatency = (double) (alsaBufferFrames - alsaPeriodFrames) / defaultSr;

    /* Base the high latency case on values four times larger */
    alsaBufferFrames = 2048;
    alsaPeriodFrames = 512;
    /* Have to reset hwParams, to set new buffer size; need to also set sample rate again */
    ENSURE_( alsa_snd_pcm_hw_params_any( pcm, hwParams ), paUnanticipatedHostError );
    ENSURE_( SetApproximateSampleRate( pcm, hwParams, defaultSr ), paUnanticipatedHostError );
    ENSURE_( alsa_snd_pcm_hw_params_set_buffer_size_near( pcm, hwParams, &alsaBufferFrames ), paUnanticipatedHostError );
    ENSURE_( alsa_snd_pcm_hw_params_set_period_size_near( pcm, hwParams, &alsaPeriodFrames, &dir ), paUnanticipatedHostError );
    *defaultHighLatency = (double) (alsaBufferFrames - alsaPeriodFrames) / defaultSr;

    *minChannels = (int)minChans;
    *maxChannels = (int)maxChans;
    *defaultSampleRate = defaultSr;

end:
    alsa_snd_pcm_close( pcm );
    return result;

error:
    goto end;
}